

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

Instr * __thiscall LowererMD::Simd128LowerMulI4(LowererMD *this,Instr *instr)

{
  Opnd *this_00;
  Opnd *this_01;
  Opnd *this_02;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *dstOpnd;
  RegOpnd *dstOpnd_00;
  RegOpnd *dstOpnd_01;
  Instr *pIVar4;
  IntConstOpnd *pIVar5;
  
  if ((instr->m_opcode != Simd128_Mul_I4) && (instr->m_opcode != Simd128_Mul_U4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x3d6,
                       "(instr->m_opcode == Js::OpCode::Simd128_Mul_I4 || instr->m_opcode == Js::OpCode::Simd128_Mul_U4)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_Mul_I4 || instr->m_opcode == Js::OpCode::Simd128_Mul_U4"
                      );
    if (!bVar2) goto LAB_005eb9b5;
    *puVar3 = 0;
  }
  this_00 = instr->m_dst;
  this_01 = instr->m_src1;
  this_02 = instr->m_src2;
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if (bVar2) {
    bVar2 = IR::Opnd::IsSimd128(this_00);
    if (!bVar2) goto LAB_005eb68d;
  }
  else {
LAB_005eb68d:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x3dc,"(dst->IsRegOpnd() && dst->IsSimd128())",
                       "dst->IsRegOpnd() && dst->IsSimd128()");
    if (!bVar2) goto LAB_005eb9b5;
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_01);
  if (bVar2) {
    bVar2 = IR::Opnd::IsSimd128(this_01);
    if (!bVar2) goto LAB_005eb6f9;
  }
  else {
LAB_005eb6f9:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x3dd,"(src1->IsRegOpnd() && src1->IsSimd128())",
                       "src1->IsRegOpnd() && src1->IsSimd128()");
    if (!bVar2) goto LAB_005eb9b5;
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_02);
  if (bVar2) {
    bVar2 = IR::Opnd::IsSimd128(this_02);
    if (bVar2) goto LAB_005eb7bd;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                     ,0x3de,"(src2->IsRegOpnd() && src2->IsSimd128())",
                     "src2->IsRegOpnd() && src2->IsSimd128()");
  if (!bVar2) {
LAB_005eb9b5:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_005eb7bd:
  dstOpnd = IR::RegOpnd::New(this_01->m_type,this->m_func);
  dstOpnd_00 = IR::RegOpnd::New(this_01->m_type,this->m_func);
  dstOpnd_01 = IR::RegOpnd::New(this_01->m_type,this->m_func);
  pIVar4 = IR::Instr::New(PMULUDQ,&dstOpnd->super_Opnd,this_01,this_02,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
  Legalize<false>(pIVar4,false);
  pIVar5 = IR::IntConstOpnd::New(4,TyInt8,this->m_func,true);
  pIVar4 = IR::Instr::New(PSRLDQ,&dstOpnd_00->super_Opnd,this_01,&pIVar5->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
  Legalize<false>(pIVar4,false);
  pIVar5 = IR::IntConstOpnd::New(4,TyInt8,this->m_func,true);
  pIVar4 = IR::Instr::New(PSRLDQ,&dstOpnd_01->super_Opnd,this_02,&pIVar5->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
  Legalize<false>(pIVar4,false);
  pIVar4 = IR::Instr::New(PMULUDQ,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,
                          &dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
  Legalize<false>(pIVar4,false);
  pIVar5 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,true);
  pIVar4 = IR::Instr::New(PSHUFD,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&pIVar5->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
  pIVar5 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,true);
  pIVar4 = IR::Instr::New(PSHUFD,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar5->super_Opnd
                          ,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
  pIVar4 = IR::Instr::New(PUNPCKLDQ,this_00,&dstOpnd->super_Opnd,&dstOpnd_00->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
  Legalize<false>(pIVar4,false);
  pIVar4 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar4;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerMulI4(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::Simd128_Mul_I4 || instr->m_opcode == Js::OpCode::Simd128_Mul_U4);
    IR::Instr *pInstr;
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    IR::Opnd* temp1, *temp2, *temp3;
    Assert(dst->IsRegOpnd() && dst->IsSimd128());
    Assert(src1->IsRegOpnd() && src1->IsSimd128());
    Assert(src2->IsRegOpnd() && src2->IsSimd128());

    temp1 = IR::RegOpnd::New(src1->GetType(), m_func);
    temp2 = IR::RegOpnd::New(src1->GetType(), m_func);
    temp3 = IR::RegOpnd::New(src1->GetType(), m_func);

    // temp1 = PMULUDQ src1, src2
    pInstr = IR::Instr::New(Js::OpCode::PMULUDQ, temp1, src1, src2, m_func);
    instr->InsertBefore(pInstr);
    //MakeDstEquSrc1(pInstr);
    Legalize(pInstr);

    // temp2 = PSLRD src1, 0x4
    pInstr = IR::Instr::New(Js::OpCode::PSRLDQ, temp2, src1, IR::IntConstOpnd::New(TySize[TyInt32], TyInt8, m_func, true), m_func);
    instr->InsertBefore(pInstr);
    //MakeDstEquSrc1(pInstr);
    Legalize(pInstr);

    // temp3 = PSLRD src2, 0x4
    pInstr = IR::Instr::New(Js::OpCode::PSRLDQ, temp3, src2, IR::IntConstOpnd::New(TySize[TyInt32], TyInt8, m_func, true), m_func);
    instr->InsertBefore(pInstr);
    //MakeDstEquSrc1(pInstr);
    Legalize(pInstr);

    // temp2 = PMULUDQ temp2, temp3
    pInstr = IR::Instr::New(Js::OpCode::PMULUDQ, temp2, temp2, temp3, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    //PSHUFD temp1, temp1, 0x8
    instr->InsertBefore(IR::Instr::New(Js::OpCode::PSHUFD, temp1, temp1, IR::IntConstOpnd::New( 8 /*b00001000*/, TyInt8, m_func, true), m_func));

    //PSHUFD temp2, temp2, 0x8
    instr->InsertBefore(IR::Instr::New(Js::OpCode::PSHUFD, temp2, temp2, IR::IntConstOpnd::New(8 /*b00001000*/, TyInt8, m_func, true), m_func));

    // PUNPCKLDQ dst, temp1, temp2
    pInstr = IR::Instr::New(Js::OpCode::PUNPCKLDQ, dst, temp1, temp2, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    pInstr = instr->m_prev;
    instr->Remove();
    return pInstr;
}